

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_io.c
# Opt level: O0

cfg_db * cfg_io_load(cfg_instance *instance,char *url,autobuf *log)

{
  char *local_38;
  char *io_param;
  cfg_io *io;
  autobuf *log_local;
  char *url_local;
  cfg_instance *instance_local;
  
  local_38 = (char *)0x0;
  io = (cfg_io *)log;
  log_local = (autobuf *)url;
  url_local = (char *)instance;
  io_param = (char *)_find_io(instance,url,&local_38,log);
  if ((cfg_io *)io_param == (cfg_io *)0x0) {
    cfg_append_printable_line((autobuf *)io,"Error, unknown config io \'%s\'.",log_local);
    instance_local = (cfg_instance *)0x0;
  }
  else if (((cfg_io *)io_param)->load == (_func_cfg_db_ptr_char_ptr_autobuf_ptr *)0x0) {
    cfg_append_printable_line
              ((autobuf *)io,"Error, config io \'%s\' does not support loading.",
               ((cfg_io *)io_param)->name);
    instance_local = (cfg_instance *)0x0;
  }
  else {
    instance_local = (cfg_instance *)(*((cfg_io *)io_param)->load)(local_38,(autobuf *)io);
  }
  return (cfg_db *)instance_local;
}

Assistant:

struct cfg_db *
cfg_io_load(struct cfg_instance *instance, const char *url, struct autobuf *log) {
  struct cfg_io *io;
  const char *io_param = NULL;

  io = _find_io(instance, url, &io_param, log);
  if (io == NULL) {
    cfg_append_printable_line(log, "Error, unknown config io '%s'.", url);
    return NULL;
  }

  if (io->load == NULL) {
    cfg_append_printable_line(log, "Error, config io '%s' does not support loading.", io->name);
    return NULL;
  }
  return io->load(io_param, log);
}